

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

DallasStatus __thiscall
AmpIO::DallasReadTool(AmpIO *this,uint32_t *model,uint8_t *version,string *name,double timeoutSec)

{
  uint uVar1;
  DallasStateType DVar2;
  BasePort *pBVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  DallasStatus DVar8;
  double dVar9;
  uint32_t ver;
  uint local_114;
  uint8_t local_110;
  undefined1 local_94;
  undefined1 local_3c;
  
  uVar6 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar6 < 7) {
    return DALLAS_NONE;
  }
  uVar6 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar6 == 0x64524131) {
    pBVar3 = (this->super_FpgaIO).super_BoardIO.port;
    iVar7 = (*pBVar3->_vptr_BasePort[0x23])
                      (pBVar3,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xb012,model);
    if ((char)iVar7 != '\0') {
      uVar1 = *model;
      *model = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      pBVar3 = (this->super_FpgaIO).super_BoardIO.port;
      iVar7 = (*pBVar3->_vptr_BasePort[0x23])
                        (pBVar3,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xb013,&ver);
      if ((char)iVar7 != '\0') {
        *version = (uint8_t)ver;
        std::__cxx11::string::assign((char *)name);
        return *version == 0xff ^ DALLAS_OK;
      }
    }
    return DALLAS_IO_ERROR;
  }
  this->dallasTimeoutSec = timeoutSec;
  DVar2 = this->dallasState;
  if (DVar2 == ST_DALLAS_READ) {
    bVar5 = DallasReadBlock(this,(uchar *)&ver,0x100);
    bVar4 = true;
    if (bVar5) {
      iVar7 = bcmp(&ver,"997",3);
      if (iVar7 == 0) {
        bVar4 = false;
        local_94 = 0;
        *model = local_114 >> 0x18 | (local_114 & 0xff0000) >> 8 | (local_114 & 0xff00) << 8 |
                 local_114 << 0x18;
        *version = local_110;
        local_3c = 0;
        std::__cxx11::string::assign((char *)name);
        this->dallasState = ST_DALLAS_START;
        DVar8 = DALLAS_OK;
      }
      else {
        DVar8 = DALLAS_DATA_ERROR;
      }
    }
    else {
      DVar8 = DALLAS_IO_ERROR;
    }
    if ((this->dallasUseDS2480B == true) && (bVar5 = DallasWriteControl(this,9), bVar5)) {
      this->dallasState = ST_DALLAS_WAIT;
      this->dallasStateNext = ST_DALLAS_START;
      dVar9 = Amp1394_GetTime();
      this->dallasWaitStart = dVar9;
    }
    if (!bVar4) {
      return DVar8;
    }
  }
  else {
    if (DVar2 == ST_DALLAS_WAIT) {
      bVar4 = DallasReadStatus(this,&ver);
      if (bVar4) {
        if ((ver & 0x20f0) == 0) {
          this->dallasState = this->dallasStateNext;
          this->dallasUseDS2480B = (bool)((byte)(ver >> 0xf) & 1);
          return DALLAS_WAIT;
        }
        dVar9 = Amp1394_GetTime();
        if (dVar9 <= this->dallasWaitStart + this->dallasTimeoutSec) {
          return DALLAS_WAIT;
        }
        DVar8 = DALLAS_TIMEOUT;
        goto LAB_001087d2;
      }
    }
    else {
      if (DVar2 != ST_DALLAS_START) {
        return DALLAS_WAIT;
      }
      bVar4 = DallasWriteControl(this,0x800002);
      if (bVar4) {
        this->dallasState = ST_DALLAS_WAIT;
        this->dallasStateNext = ST_DALLAS_READ;
        dVar9 = Amp1394_GetTime();
        this->dallasWaitStart = dVar9;
        return DALLAS_WAIT;
      }
    }
    DVar8 = DALLAS_IO_ERROR;
  }
LAB_001087d2:
  this->dallasState = ST_DALLAS_START;
  return DVar8;
}

Assistant:

AmpIO::DallasStatus AmpIO::DallasReadTool(uint32_t &model, uint8_t &version, std::string &name,
                                          double timeoutSec)
{
    DallasStatus ret = DALLAS_WAIT;

    if (GetFirmwareVersion() < 7) {
        ret = DALLAS_NONE;
    }
    else if (GetHardwareVersion() == dRA1_String) {
        if (!port->ReadQuadlet(BoardId, 0xb012, model))
            return DALLAS_IO_ERROR;
        model = bswap_32(model);
        uint32_t ver;
        if (!port->ReadQuadlet(BoardId, 0xb013, ver))
            return DALLAS_IO_ERROR;
        version = ver & 0x000000ff;
        name = "";
        if (version != 255)
            ret = DALLAS_OK;
    }
    else {   // QLA or DQLA

        uint32_t status;
        uint32_t ctrl;
        char buffer[256];

        dallasTimeoutSec = timeoutSec;

        switch (dallasState) {

        case ST_DALLAS_START:
            // Start reading at address DALLAS_START_READ
            ctrl = (DALLAS_START_READ<<16)|2;
            if (DallasWriteControl(ctrl)) {
                dallasState = ST_DALLAS_WAIT;
                dallasStateNext = ST_DALLAS_READ;
                dallasWaitStart = Amp1394_GetTime();
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            break;

        case ST_DALLAS_WAIT:
            if (DallasReadStatus(status)) {
                // Done when in idle state. The following test works for both Firmware Rev 7
                // (state is bits 7:4) and Firmware Rev 8 (state is bits 8:4 and busy flag is bit 13)
                if ((status&0x000020F0) == 0) {
                    dallasState = dallasStateNext;
                    // Automatically detect interface in use
                    dallasUseDS2480B = (status & 0x00008000) == 0x00008000;
                }
                else if (Amp1394_GetTime() > dallasWaitStart + dallasTimeoutSec) {
                    ret = DALLAS_TIMEOUT;
                }
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            break;

        case ST_DALLAS_READ:
            if (DallasReadBlock(reinterpret_cast<unsigned char *>(buffer), sizeof(buffer))) {
                // make sure we read the 997 from company statement
                if (strncmp(buffer, "997", 3) == 0) {
                    // get model and name of tool to create unique string identifier
                    // model number uses only 3 bytes, set first one to zero just in case
                    buffer[DALLAS_MODEL_OFFSET] = 0;
                    model = *(reinterpret_cast<uint32_t *>(buffer + (DALLAS_MODEL_OFFSET - DALLAS_START_READ)));
                    model = bswap_32(model);
                    // version number
                    version = static_cast<uint8_t>(buffer[DALLAS_VERSION_OFFSET - DALLAS_START_READ]);
                    // name
                    buffer[DALLAS_NAME_END - DALLAS_START_READ] = '\0';
                    name = buffer + (DALLAS_NAME_OFFSET - DALLAS_START_READ);
                    ret = DALLAS_OK;
                    dallasState = ST_DALLAS_START;  // Nominal; could be updated below for DS2480B
                }
                else {
                    ret = DALLAS_DATA_ERROR;
                }
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            if (dallasUseDS2480B) {
                // 0x09 indicates reg_wdata[3] == 1 && reg_wdata[1:0] == 01 in firmware DS2505.v
                // If the write fails, we ignore it and return to ST_DALLAS_START, rather than
                // return DALLAS_IO_ERROR, because this is after the read.
                if (DallasWriteControl(0x09)){
                    dallasState = ST_DALLAS_WAIT;
                    dallasStateNext = ST_DALLAS_START;
                    dallasWaitStart = Amp1394_GetTime();
                }
            }
            break;
        }

        if ((ret == DALLAS_IO_ERROR) || (ret == DALLAS_TIMEOUT) || (ret == DALLAS_DATA_ERROR)) {
            dallasState = ST_DALLAS_START;
        }
    }

    return ret;
}